

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3DropTable(Parse *pParse,SrcList *pName,int isView,int noErr)

{
  sqlite3 *db;
  Schema *pSVar1;
  int iVar2;
  int iVar3;
  Table *pTable;
  VTable *pVVar4;
  Vdbe *pVVar5;
  Schema **ppSVar6;
  char *pcVar7;
  char *pcVar8;
  
  db = pParse->db;
  if ((db->mallocFailed != '\0') || (iVar2 = sqlite3ReadSchema(pParse), iVar2 != 0))
  goto LAB_00172c8e;
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + '\x01';
  }
  pTable = sqlite3LocateTableItem(pParse,isView,pName->a);
  if (noErr != 0) {
    db->suppressErr = db->suppressErr + 0xff;
  }
  if (pTable == (Table *)0x0) {
    if (noErr != 0) {
      sqlite3CodeVerifyNamedSchema(pParse,pName->a[0].zDatabase);
    }
    goto LAB_00172c8e;
  }
  if (pTable->pSchema == (Schema *)0x0) {
    iVar2 = -1000000;
  }
  else {
    iVar2 = -1;
    ppSVar6 = &db->aDb->pSchema;
    do {
      iVar2 = iVar2 + 1;
      pSVar1 = *ppSVar6;
      ppSVar6 = ppSVar6 + 4;
    } while (pSVar1 != pTable->pSchema);
  }
  if ((pTable->nModuleArg != 0) && (iVar3 = sqlite3ViewGetColumnNames(pParse,pTable), iVar3 != 0))
  goto LAB_00172c8e;
  pcVar7 = "sqlite_master";
  if (iVar2 == 1) {
    pcVar7 = "sqlite_temp_master";
  }
  pcVar8 = db->aDb[iVar2].zDbSName;
  iVar3 = sqlite3AuthCheck(pParse,9,pcVar7,(char *)0x0,pcVar8);
  if (iVar3 != 0) goto LAB_00172c8e;
  if (isView == 0) {
    if (pTable->nModuleArg == 0) {
      iVar3 = (uint)(iVar2 == 1) * 2 + 0xb;
      pcVar7 = (char *)0x0;
    }
    else {
      for (pVVar4 = pTable->pVTable; (pVVar4 != (VTable *)0x0 && (pVVar4->db != db));
          pVVar4 = pVVar4->pNext) {
      }
      pcVar7 = pVVar4->pMod->zName;
      iVar3 = 0x1e;
    }
  }
  else {
    iVar3 = (uint)(iVar2 != 1) * 2 + 0xf;
    pcVar7 = (char *)0x0;
  }
  iVar3 = sqlite3AuthCheck(pParse,iVar3,pTable->zName,pcVar7,pcVar8);
  if ((iVar3 != 0) ||
     (iVar3 = sqlite3AuthCheck(pParse,9,pTable->zName,(char *)0x0,pcVar8), iVar3 != 0))
  goto LAB_00172c8e;
  pcVar7 = pTable->zName;
  iVar3 = sqlite3_strnicmp(pcVar7,"sqlite_",7);
  if ((iVar3 == 0) && (iVar3 = sqlite3_strnicmp(pcVar7,"sqlite_stat",0xb), iVar3 != 0)) {
    pcVar8 = "table %s may not be dropped";
  }
  else if (isView == 0) {
    if (pTable->pSelect == (Select *)0x0) goto LAB_00172e74;
    pcVar8 = "use DROP VIEW to delete view %s";
  }
  else {
    if (pTable->pSelect != (Select *)0x0) {
LAB_00172e74:
      pVVar5 = sqlite3GetVdbe(pParse);
      if (pVVar5 != (Vdbe *)0x0) {
        sqlite3BeginWriteOperation(pParse,1,iVar2);
        if (isView == 0) {
          sqlite3ClearStatTables(pParse,iVar2,"tbl",pTable->zName);
          sqlite3FkDropTable(pParse,pName,pTable);
        }
        sqlite3CodeDropTable(pParse,pTable,iVar2,isView);
      }
      goto LAB_00172c8e;
    }
    pcVar8 = "use DROP TABLE to delete table %s";
  }
  sqlite3ErrorMsg(pParse,pcVar8,pcVar7);
LAB_00172c8e:
  sqlite3SrcListDelete(db,pName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTable(Parse *pParse, SrcList *pName, int isView, int noErr){
  Table *pTab;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  if( db->mallocFailed ){
    goto exit_drop_table;
  }
  assert( pParse->nErr==0 );
  assert( pName->nSrc==1 );
  if( sqlite3ReadSchema(pParse) ) goto exit_drop_table;
  if( noErr ) db->suppressErr++;
  assert( isView==0 || isView==LOCATE_VIEW );
  pTab = sqlite3LocateTableItem(pParse, isView, &pName->a[0]);
  if( noErr ) db->suppressErr--;

  if( pTab==0 ){
    if( noErr ) sqlite3CodeVerifyNamedSchema(pParse, pName->a[0].zDatabase);
    goto exit_drop_table;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb>=0 && iDb<db->nDb );

  /* If pTab is a virtual table, call ViewGetColumnNames() to ensure
  ** it is initialized.
  */
  if( IsVirtual(pTab) && sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto exit_drop_table;
  }
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code;
    const char *zTab = SCHEMA_TABLE(iDb);
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zArg2 = 0;
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb)){
      goto exit_drop_table;
    }
    if( isView ){
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_VIEW;
      }else{
        code = SQLITE_DROP_VIEW;
      }
#ifndef SQLITE_OMIT_VIRTUALTABLE
    }else if( IsVirtual(pTab) ){
      code = SQLITE_DROP_VTABLE;
      zArg2 = sqlite3GetVTable(db, pTab)->pMod->zName;
#endif
    }else{
      if( !OMIT_TEMPDB && iDb==1 ){
        code = SQLITE_DROP_TEMP_TABLE;
      }else{
        code = SQLITE_DROP_TABLE;
      }
    }
    if( sqlite3AuthCheck(pParse, code, pTab->zName, zArg2, zDb) ){
      goto exit_drop_table;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0, zDb) ){
      goto exit_drop_table;
    }
  }
#endif
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 
    && sqlite3StrNICmp(pTab->zName, "sqlite_stat", 11)!=0 ){
    sqlite3ErrorMsg(pParse, "table %s may not be dropped", pTab->zName);
    goto exit_drop_table;
  }

#ifndef SQLITE_OMIT_VIEW
  /* Ensure DROP TABLE is not used on a view, and DROP VIEW is not used
  ** on a table.
  */
  if( isView && pTab->pSelect==0 ){
    sqlite3ErrorMsg(pParse, "use DROP TABLE to delete table %s", pTab->zName);
    goto exit_drop_table;
  }
  if( !isView && pTab->pSelect ){
    sqlite3ErrorMsg(pParse, "use DROP VIEW to delete view %s", pTab->zName);
    goto exit_drop_table;
  }
#endif

  /* Generate code to remove the table from the master table
  ** on disk.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    sqlite3BeginWriteOperation(pParse, 1, iDb);
    if( !isView ){
      sqlite3ClearStatTables(pParse, iDb, "tbl", pTab->zName);
      sqlite3FkDropTable(pParse, pName, pTab);
    }
    sqlite3CodeDropTable(pParse, pTab, iDb, isView);
  }

exit_drop_table:
  sqlite3SrcListDelete(db, pName);
}